

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posixcrashhandler.cpp
# Opt level: O0

void __thiscall Debug::PosixCrashHandler::teardown(PosixCrashHandler *this)

{
  undefined1 local_128 [8];
  sigset_t mysigset;
  sigaction sa;
  PosixCrashHandler *this_local;
  
  sa.sa_restorer = (_func_void *)this;
  sigemptyset((sigset_t *)local_128);
  mysigset.__val[0xf] = 0;
  memcpy(&sa,local_128,0x80);
  sa.sa_mask.__val[0xf]._0_4_ = 0;
  sigaction(6,(sigaction *)(mysigset.__val + 0xf),(sigaction *)0x0);
  sigaction(0xb,(sigaction *)(mysigset.__val + 0xf),(sigaction *)0x0);
  sigaction(7,(sigaction *)(mysigset.__val + 0xf),(sigaction *)0x0);
  sigaction(4,(sigaction *)(mysigset.__val + 0xf),(sigaction *)0x0);
  sigaction(8,(sigaction *)(mysigset.__val + 0xf),(sigaction *)0x0);
  sigaction(0xd,(sigaction *)(mysigset.__val + 0xf),(sigaction *)0x0);
  sigaction(0xf,(sigaction *)(mysigset.__val + 0xf),(sigaction *)0x0);
  return;
}

Assistant:

void PosixCrashHandler::teardown() {
        struct sigaction sa;
        sigset_t mysigset;
        
        sigemptyset(&mysigset);
        
        sa.sa_handler = SIG_DFL;
        sa.sa_mask = mysigset;
        sa.sa_flags = 0;

        sigaction( SIGABRT, &sa, NULL );
        sigaction( SIGSEGV, &sa, NULL );
        sigaction( SIGBUS,  &sa, NULL );
        sigaction( SIGILL,  &sa, NULL );
        sigaction( SIGFPE,  &sa, NULL );
        sigaction( SIGPIPE, &sa, NULL );
        sigaction( SIGTERM, &sa, NULL );
    }